

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O3

void * QRunnable::QGenericRunnable::Helper<std::function<void_()>_>::impl
                 (Op op,HelperBase *that,void *arg)

{
  undefined8 uVar1;
  
  if (op == Destroy) {
    if ((that != (HelperBase *)0x0) && (that[3].fn != (OpFn)0x0)) {
      (*that[3].fn)((Op)(that + 1),that + 1,(void *)0x3);
    }
    operator_delete(that,0x28);
  }
  else if (op == Run) {
    if (that[3].fn == (OpFn)0x0) {
      uVar1 = std::__throw_bad_function_call();
      __clang_call_terminate(uVar1);
    }
    (*that[4].fn)((int)that + 8,that,arg);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }